

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emissive.cpp
# Opt level: O2

RGBColor __thiscall pm::Emissive::globalShade(Emissive *this,ShadeRecord *sr)

{
  undefined8 *in_RDI;
  undefined8 uVar1;
  float fVar2;
  RGBColor RVar3;
  
  uVar1 = 0;
  fVar2 = 0.0;
  if ((sr->depth != 1) &&
     (fVar2 = 0.0,
     0.0 < (-(sr->normal).x * (sr->ray).d.x - (sr->ray).d.y * (sr->normal).y) -
           (sr->normal).z * (sr->ray).d.z)) {
    uVar1 = *(undefined8 *)&(this->super_Material).field_0xc;
    fVar2 = (float)uVar1;
    uVar1 = CONCAT44((this->ce_).g * fVar2,fVar2 * (float)((ulong)uVar1 >> 0x20));
    fVar2 = fVar2 * (this->ce_).b;
  }
  *in_RDI = uVar1;
  *(float *)(in_RDI + 1) = fVar2;
  RVar3.b = fVar2;
  RVar3.r = (float)(int)uVar1;
  RVar3.g = (float)(int)((ulong)uVar1 >> 0x20);
  return RVar3;
}

Assistant:

RGBColor Emissive::globalShade(ShadeRecord &sr) const
{
	if (sr.depth == 1)
		return RGBColor(0.0f, 0.0f, 0.0f);

	if (dot(-sr.normal, sr.ray.d) > 0.0)
		return (ls_ * ce_);
	else
		return RGBColor(0.0f, 0.0f, 0.0f);
}